

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_any.hpp
# Opt level: O1

double Omega_h::any_cast<double>(any *operand)

{
  bool bVar1;
  undefined8 *puVar2;
  
  bVar1 = any::is_typed(operand,(type_info *)&double::typeinfo);
  if (bVar1) {
    return (double)(operand->storage).dynamic;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = std::__cxx11::string::_M_create;
  __cxa_throw(puVar2,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

inline ValueType any_cast(any& operand) {
  auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
  if (p == nullptr) throw bad_any_cast();
  return *p;
}